

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

void hash_add(adh_node_t *node,hash_entry_t *entry)

{
  uint uVar1;
  hash_entry *local_38;
  hash_entry_t *local_30;
  hash_entry_t *last;
  hash_entry_t *new_entry;
  int hash_index;
  hash_entry_t *entry_local;
  adh_node_t *node_local;
  
  uVar1 = hash_get_index(node->weight);
  local_38 = entry;
  if (entry == (hash_entry_t *)0x0) {
    local_38 = (hash_entry *)calloc(1,0x18);
  }
  local_38->value = node;
  local_30 = map_weight_nodes.buckets[(int)uVar1];
  if (local_30 == (hash_entry_t *)0x0) {
    map_weight_nodes.buckets[(int)uVar1] = local_38;
  }
  else {
    for (; local_30->next != (hash_entry *)0x0; local_30 = local_30->next) {
    }
    local_30->next = local_38;
    local_38->prev = local_30;
  }
  return;
}

Assistant:

void hash_add(adh_node_t* node, hash_entry_t *entry){
    int hash_index = hash_get_index(node->weight);

    hash_entry_t  *new_entry = entry != NULL ? entry : calloc(1, sizeof(hash_entry_t));
    new_entry->value = node;

    hash_entry_t  *last = map_weight_nodes.buckets[hash_index];
    if(last == NULL) {
        map_weight_nodes.buckets[hash_index] = new_entry;
    }
    else {
        while(last->next) {
            last = last->next;
        }

        last->next = new_entry;
        new_entry->prev = last;
    }
}